

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title-threadsafe.c
# Opt level: O1

void getter_thread_body(void *arg)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char buffer [512];
  char acStack_228 [512];
  
  iVar1 = uv_get_process_title(acStack_228,0x200);
  do {
    if (iVar1 != 0) {
      pcVar3 = "0 == uv_get_process_title(buffer, sizeof(buffer))";
      uVar2 = 0x2d;
LAB_00165bc3:
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-title-threadsafe.c"
              ,uVar2,pcVar3);
      abort();
    }
    iVar1 = bcmp(acStack_228,
                 "8L2NY0Kdj0XyNFZnmUZigIOfcWjyNr0SkMmUhKw99VLUsZFrvCQQC3XIRfNR8pjyMjXObllled",0x4b);
    if ((((iVar1 != 0) &&
         (iVar1 = bcmp(acStack_228,
                       "jUAcscJN49oLSN8GdmXj2Wo34XX2T2vp2j5khfajNQarlOulp57cE130yiY53ipJFnPyTn5i82",
                       0x4b), iVar1 != 0)) &&
        (iVar1 = bcmp(acStack_228,
                      "9niCI5icXGFS72XudhXqo5alftmZ1tpE7B3cwUmrq0CCDjC84FzBNB8XAHqvpNQfI2QAQG6ztT",
                      0x4b), iVar1 != 0)) &&
       (iVar1 = bcmp(acStack_228,
                     "n8qXVXuG6IEHDpabJgTEiwtpY6LHMZ8MgznnMpdHARu5EywufA6hcBaQfetb0YhEsK0ykDd7JU",
                     0x4b), iVar1 != 0)) {
      pcVar3 = 
      "0 == strcmp(buffer, titles[0]) || 0 == strcmp(buffer, titles[1]) || 0 == strcmp(buffer, titles[2]) || 0 == strcmp(buffer, titles[3])"
      ;
      uVar2 = 0x32;
      goto LAB_00165bc3;
    }
    uv_sleep(0);
    iVar1 = uv_get_process_title(acStack_228,0x200);
  } while( true );
}

Assistant:

static void getter_thread_body(void* arg) {
  char buffer[512];

  for (;;) {
    ASSERT(0 == uv_get_process_title(buffer, sizeof(buffer)));
    ASSERT(
      0 == strcmp(buffer, titles[0]) ||
      0 == strcmp(buffer, titles[1]) ||
      0 == strcmp(buffer, titles[2]) ||
      0 == strcmp(buffer, titles[3]));

    uv_sleep(0);
  }
}